

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void add_reg_to_rw_list(MCInst *MI,m680x_reg reg,e_access access)

{
  uint16_t *regs;
  uint16_t uVar1;
  _Bool _Var2;
  uint16_t uVar3;
  undefined4 in_EDX;
  m680x_reg in_ESI;
  long in_RDI;
  cs_detail *detail;
  
  regs = *(uint16_t **)(*(long *)(in_RDI + 0x310) + 0xf0);
  if ((regs != (uint16_t *)0x0) && (in_ESI != M680X_REG_INVALID)) {
    uVar3 = (uint16_t)in_ESI;
    switch(in_EDX) {
    case 0:
      break;
    case 1:
      _Var2 = exists_reg_list(regs,(uint8_t)regs[0x10],in_ESI);
      if (!_Var2) {
        uVar1 = regs[0x10];
        *(byte *)(regs + 0x10) = (byte)uVar1 + 1;
        regs[(byte)uVar1] = uVar3;
      }
      break;
    case 3:
      _Var2 = exists_reg_list(regs,(uint8_t)regs[0x10],in_ESI);
      if (!_Var2) {
        uVar1 = regs[0x10];
        *(byte *)(regs + 0x10) = (byte)uVar1 + 1;
        regs[(byte)uVar1] = uVar3;
      }
    case 2:
      _Var2 = exists_reg_list(regs + 0x11,(uint8_t)regs[0x25],in_ESI);
      if (!_Var2) {
        uVar1 = regs[0x25];
        *(byte *)(regs + 0x25) = (byte)uVar1 + 1;
        regs[(ulong)(byte)uVar1 + 0x11] = uVar3;
      }
    }
  }
  return;
}

Assistant:

static void add_reg_to_rw_list(m68k_info *info, m68k_reg reg, int write)
{
	if (reg == M68K_REG_INVALID)
		return;

	if (write)
	{
		if (exists_reg_list(info->regs_write, info->regs_write_count, reg))
			return;

		info->regs_write[info->regs_write_count] = (uint16_t)reg;
		info->regs_write_count++;
	}
	else
	{
		if (exists_reg_list(info->regs_read, info->regs_read_count, reg))
			return;

		info->regs_read[info->regs_read_count] = (uint16_t)reg;
		info->regs_read_count++;
	}
}